

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-getsockname.c
# Opt level: O1

int run_test_pipe_getsockname(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  uint __fd;
  int extraout_EAX_01;
  uv_loop_t *puVar2;
  uv_loop_t *unaff_RBX;
  int in_ESI;
  uv_loop_t *puVar3;
  uv_pipe_t *in_RDI;
  uv_pipe_t *loop;
  uv_pipe_t *unaff_R14;
  size_t len;
  char buf [1024];
  size_t sStack_cd8;
  sockaddr sStack_cd0;
  undefined8 uStack_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 uStack_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 uStack_c80;
  undefined6 uStack_c78;
  undefined2 uStack_c72;
  undefined6 uStack_c70;
  undefined8 uStack_c6a;
  undefined3 uStack_c60;
  undefined5 uStack_c5d;
  undefined3 uStack_c58;
  uv_loop_t *puStack_858;
  uv_loop_t *puStack_850;
  undefined8 uStack_840;
  uv_loop_t uStack_838;
  uv_loop_t *puStack_438;
  code *pcStack_430;
  undefined8 local_420;
  uv_loop_t local_418;
  
  pcStack_430 = (code *)0x162edb;
  puVar2 = uv_default_loop();
  if (puVar2 == (uv_loop_t *)0x0) {
    pcStack_430 = (code *)0x163181;
    run_test_pipe_getsockname_cold_22();
LAB_00163181:
    pcStack_430 = (code *)0x163186;
    run_test_pipe_getsockname_cold_1();
LAB_00163186:
    pcStack_430 = (code *)0x16318b;
    run_test_pipe_getsockname_cold_2();
LAB_0016318b:
    pcStack_430 = (code *)0x163190;
    run_test_pipe_getsockname_cold_3();
LAB_00163190:
    pcStack_430 = (code *)0x163195;
    run_test_pipe_getsockname_cold_4();
LAB_00163195:
    pcStack_430 = (code *)0x16319a;
    run_test_pipe_getsockname_cold_5();
LAB_0016319a:
    pcStack_430 = (code *)0x16319f;
    run_test_pipe_getsockname_cold_21();
LAB_0016319f:
    pcStack_430 = (code *)0x1631a4;
    run_test_pipe_getsockname_cold_6();
LAB_001631a4:
    pcStack_430 = (code *)0x1631a9;
    run_test_pipe_getsockname_cold_7();
LAB_001631a9:
    pcStack_430 = (code *)0x1631ae;
    run_test_pipe_getsockname_cold_8();
LAB_001631ae:
    pcStack_430 = (code *)0x1631b3;
    run_test_pipe_getsockname_cold_9();
LAB_001631b3:
    pcStack_430 = (code *)0x1631b8;
    run_test_pipe_getsockname_cold_10();
LAB_001631b8:
    pcStack_430 = (code *)0x1631bd;
    run_test_pipe_getsockname_cold_11();
LAB_001631bd:
    pcStack_430 = (code *)0x1631c2;
    run_test_pipe_getsockname_cold_12();
LAB_001631c2:
    pcStack_430 = (code *)0x1631c7;
    run_test_pipe_getsockname_cold_13();
LAB_001631c7:
    pcStack_430 = (code *)0x1631cc;
    run_test_pipe_getsockname_cold_14();
LAB_001631cc:
    pcStack_430 = (code *)0x1631d1;
    run_test_pipe_getsockname_cold_20();
LAB_001631d1:
    pcStack_430 = (code *)0x1631d6;
    run_test_pipe_getsockname_cold_15();
LAB_001631d6:
    pcStack_430 = (code *)0x1631db;
    run_test_pipe_getsockname_cold_16();
LAB_001631db:
    pcStack_430 = (code *)0x1631e0;
    run_test_pipe_getsockname_cold_17();
LAB_001631e0:
    pcStack_430 = (code *)0x1631e5;
    run_test_pipe_getsockname_cold_18();
  }
  else {
    in_ESI = 0x3287b8;
    pcStack_430 = (code *)0x162ef8;
    in_RDI = (uv_pipe_t *)puVar2;
    iVar1 = uv_pipe_init(puVar2,&pipe_server,0);
    unaff_RBX = puVar2;
    if (iVar1 != 0) goto LAB_00163181;
    local_420 = 0x400;
    in_RDI = &pipe_server;
    puVar3 = &local_418;
    pcStack_430 = (code *)0x162f1d;
    iVar1 = uv_pipe_getsockname(&pipe_server,(char *)puVar3,&local_420);
    in_ESI = (int)puVar3;
    if (iVar1 != -9) goto LAB_00163186;
    local_420 = 0x400;
    in_RDI = &pipe_server;
    puVar3 = &local_418;
    pcStack_430 = (code *)0x162f43;
    iVar1 = uv_pipe_getpeername(&pipe_server,(char *)puVar3,&local_420);
    in_ESI = (int)puVar3;
    if (iVar1 != -9) goto LAB_0016318b;
    in_RDI = &pipe_server;
    in_ESI = 0x18e322;
    pcStack_430 = (code *)0x162f5f;
    iVar1 = uv_pipe_bind(&pipe_server,"/tmp/uv-test-sock");
    if (iVar1 != 0) goto LAB_00163190;
    local_420 = 0x400;
    in_RDI = &pipe_server;
    unaff_R14 = (uv_pipe_t *)&local_418;
    pcStack_430 = (code *)0x162f87;
    puVar3 = (uv_loop_t *)unaff_R14;
    iVar1 = uv_pipe_getsockname(&pipe_server,(char *)unaff_R14,&local_420);
    in_ESI = (int)puVar3;
    if (iVar1 != 0) goto LAB_00163195;
    if (*(char *)((long)((uv_loop_t *)unaff_R14)->handle_queue + (local_420 - 0x11)) == '\0')
    goto LAB_0016319a;
    if (*(char *)((long)local_418.handle_queue + (local_420 - 0x10)) != '\0') goto LAB_0016319f;
    in_ESI = 0x18e322;
    in_RDI = (uv_pipe_t *)&local_418;
    pcStack_430 = (code *)0x162fbc;
    iVar1 = bcmp(in_RDI,"/tmp/uv-test-sock",local_420);
    if (iVar1 != 0) goto LAB_001631a4;
    local_420 = 0x400;
    in_RDI = &pipe_server;
    puVar3 = &local_418;
    pcStack_430 = (code *)0x162fe1;
    iVar1 = uv_pipe_getpeername(&pipe_server,(char *)puVar3,&local_420);
    in_ESI = (int)puVar3;
    if (iVar1 != -0x6b) goto LAB_001631a9;
    in_RDI = &pipe_server;
    in_ESI = 0;
    pcStack_430 = (code *)0x162fff;
    iVar1 = uv_listen((uv_stream_t *)&pipe_server,0,pipe_server_connection_cb);
    if (iVar1 != 0) goto LAB_001631ae;
    in_ESI = 0x3288c0;
    pcStack_430 = (code *)0x163018;
    in_RDI = (uv_pipe_t *)puVar2;
    iVar1 = uv_pipe_init(puVar2,&pipe_client,0);
    if (iVar1 != 0) goto LAB_001631b3;
    local_420 = 0x400;
    in_RDI = &pipe_client;
    puVar3 = &local_418;
    pcStack_430 = (code *)0x16303d;
    iVar1 = uv_pipe_getsockname(&pipe_client,(char *)puVar3,&local_420);
    in_ESI = (int)puVar3;
    if (iVar1 != -9) goto LAB_001631b8;
    local_420 = 0x400;
    in_RDI = &pipe_client;
    puVar3 = &local_418;
    pcStack_430 = (code *)0x163063;
    iVar1 = uv_pipe_getpeername(&pipe_client,(char *)puVar3,&local_420);
    in_ESI = (int)puVar3;
    if (iVar1 != -9) goto LAB_001631bd;
    unaff_R14 = &pipe_client;
    pcStack_430 = (code *)0x163090;
    uv_pipe_connect(&connect_req,&pipe_client,"/tmp/uv-test-sock",pipe_client_connect_cb);
    local_420 = 0x400;
    puVar3 = &local_418;
    in_RDI = &pipe_client;
    pcStack_430 = (code *)0x1630a9;
    iVar1 = uv_pipe_getsockname(&pipe_client,(char *)puVar3,&local_420);
    in_ESI = (int)puVar3;
    if ((iVar1 != 0) || (local_420 != 0)) goto LAB_001631c2;
    local_420 = 0x400;
    in_RDI = &pipe_client;
    unaff_R14 = (uv_pipe_t *)&local_418;
    pcStack_430 = (code *)0x1630dd;
    puVar3 = (uv_loop_t *)unaff_R14;
    iVar1 = uv_pipe_getpeername(&pipe_client,(char *)unaff_R14,&local_420);
    in_ESI = (int)puVar3;
    if (iVar1 != 0) goto LAB_001631c7;
    if (*(char *)((long)((uv_loop_t *)unaff_R14)->handle_queue + (local_420 - 0x11)) == '\0')
    goto LAB_001631cc;
    in_ESI = 0x18e322;
    in_RDI = (uv_pipe_t *)&local_418;
    pcStack_430 = (code *)0x163107;
    iVar1 = bcmp(in_RDI,"/tmp/uv-test-sock",local_420);
    if (iVar1 != 0) goto LAB_001631d1;
    in_ESI = 0;
    pcStack_430 = (code *)0x163119;
    in_RDI = (uv_pipe_t *)puVar2;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_001631d6;
    if (pipe_client_connect_cb_called != 1) goto LAB_001631db;
    if (pipe_close_cb_called != 2) goto LAB_001631e0;
    pcStack_430 = (code *)0x163140;
    unaff_RBX = uv_default_loop();
    pcStack_430 = (code *)0x163154;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    in_ESI = 0;
    pcStack_430 = (code *)0x16315e;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    pcStack_430 = (code *)0x163163;
    in_RDI = (uv_pipe_t *)uv_default_loop();
    pcStack_430 = (code *)0x16316b;
    iVar1 = uv_loop_close((uv_loop_t *)in_RDI);
    if (iVar1 == 0) {
      return 0;
    }
  }
  pcStack_430 = pipe_server_connection_cb;
  run_test_pipe_getsockname_cold_19();
  if (in_ESI == 0) {
    return extraout_EAX;
  }
  puStack_438 = (uv_loop_t *)pipe_client_connect_cb;
  pipe_server_connection_cb_cold_1();
  puStack_438 = unaff_RBX;
  if (in_RDI == (uv_pipe_t *)&connect_req) {
    if (in_ESI != 0) goto LAB_001632c4;
    uStack_840 = 0x400;
    puStack_850 = (uv_loop_t *)0x163235;
    iVar1 = uv_pipe_getpeername(&pipe_client,(char *)&uStack_838,&uStack_840);
    unaff_RBX = &uStack_838;
    if (iVar1 != 0) goto LAB_001632c9;
    if (*(char *)((long)uStack_838.handle_queue + (uStack_840 - 0x11)) == '\0') goto LAB_001632ce;
    puStack_850 = (uv_loop_t *)0x16325e;
    iVar1 = bcmp(&uStack_838,"/tmp/uv-test-sock",uStack_840);
    if (iVar1 != 0) goto LAB_001632d3;
    uStack_840 = 0x400;
    puStack_850 = (uv_loop_t *)0x16327f;
    iVar1 = uv_pipe_getsockname(&pipe_client,(char *)&uStack_838,&uStack_840);
    if ((iVar1 == 0) && (uStack_840 == 0)) {
      pipe_client_connect_cb_called = pipe_client_connect_cb_called + 1;
      puStack_850 = (uv_loop_t *)0x1632a7;
      uv_close((uv_handle_t *)&pipe_client,pipe_close_cb);
      puStack_850 = (uv_loop_t *)0x1632b6;
      uv_close((uv_handle_t *)&pipe_server,pipe_close_cb);
      return extraout_EAX_00;
    }
  }
  else {
    puStack_850 = (uv_loop_t *)0x1632c4;
    pipe_client_connect_cb_cold_1();
LAB_001632c4:
    puStack_850 = (uv_loop_t *)0x1632c9;
    pipe_client_connect_cb_cold_2();
LAB_001632c9:
    puStack_850 = (uv_loop_t *)0x1632ce;
    pipe_client_connect_cb_cold_3();
LAB_001632ce:
    puStack_850 = (uv_loop_t *)0x1632d3;
    pipe_client_connect_cb_cold_6();
LAB_001632d3:
    puStack_850 = (uv_loop_t *)0x1632d8;
    pipe_client_connect_cb_cold_4();
  }
  puStack_850 = (uv_loop_t *)run_test_pipe_getsockname_abstract;
  pipe_client_connect_cb_cold_5();
  loop = (uv_pipe_t *)0x1;
  puStack_858 = unaff_RBX;
  puStack_850 = (uv_loop_t *)unaff_R14;
  __fd = socket(1,1,0);
  if (__fd == 0xffffffff) {
    run_test_pipe_getsockname_abstract_cold_8();
LAB_0016344b:
    run_test_pipe_getsockname_abstract_cold_1();
LAB_00163450:
    run_test_pipe_getsockname_abstract_cold_2();
LAB_00163455:
    run_test_pipe_getsockname_abstract_cold_3();
LAB_0016345a:
    run_test_pipe_getsockname_abstract_cold_4();
LAB_0016345f:
    run_test_pipe_getsockname_abstract_cold_5();
  }
  else {
    sStack_cd0.sa_data[0xb] = '\0';
    sStack_cd0.sa_data[0xc] = '\0';
    sStack_cd0.sa_data[0xd] = '\0';
    uStack_c70 = 0;
    uStack_c6a = 0;
    uStack_c80 = 0;
    uStack_c78 = 0;
    uStack_c72 = 0;
    uStack_c90 = 0;
    uStack_c88 = 0;
    uStack_ca0 = 0;
    uStack_c98 = 0;
    uStack_cb0 = 0;
    uStack_ca8 = 0;
    uStack_cc0 = 0;
    uStack_cb8 = 0;
    sStack_cd0.sa_family = 1;
    sStack_cd0.sa_data[0] = '\0';
    sStack_cd0.sa_data[1] = 't';
    sStack_cd0.sa_data[2] = 'e';
    sStack_cd0.sa_data[3] = 's';
    sStack_cd0.sa_data[4] = 't';
    sStack_cd0.sa_data[5] = '-';
    sStack_cd0.sa_data[6] = 'p';
    sStack_cd0.sa_data[7] = 'i';
    sStack_cd0.sa_data[8] = 'p';
    sStack_cd0.sa_data[9] = 'e';
    sStack_cd0.sa_data[10] = '\0';
    loop = (uv_pipe_t *)(ulong)__fd;
    iVar1 = bind(__fd,&sStack_cd0,0x6e);
    if (iVar1 != 0) goto LAB_0016344b;
    loop = (uv_pipe_t *)uv_default_loop();
    iVar1 = uv_pipe_init((uv_loop_t *)loop,&pipe_server,0);
    if (iVar1 != 0) goto LAB_00163450;
    loop = &pipe_server;
    iVar1 = uv_pipe_open(&pipe_server,__fd);
    if (iVar1 != 0) goto LAB_00163455;
    sStack_cd8 = 0x400;
    loop = &pipe_server;
    iVar1 = uv_pipe_getsockname(&pipe_server,(char *)&uStack_c60,&sStack_cd8);
    if (iVar1 != 0) goto LAB_0016345a;
    if (CONCAT35(uStack_c58,uStack_c5d) != 0x657069702d7473 ||
        CONCAT53(uStack_c5d,uStack_c60) != 0x69702d7473657400) goto LAB_0016345f;
    uv_close((uv_handle_t *)&pipe_server,pipe_close_cb);
    puVar2 = uv_default_loop();
    uv_run(puVar2,UV_RUN_DEFAULT);
    loop = (uv_pipe_t *)(ulong)__fd;
    close(__fd);
    if (pipe_close_cb_called == 1) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      loop = (uv_pipe_t *)uv_default_loop();
      iVar1 = uv_loop_close((uv_loop_t *)loop);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_00163469;
    }
  }
  run_test_pipe_getsockname_abstract_cold_6();
LAB_00163469:
  run_test_pipe_getsockname_abstract_cold_7();
  if (loop == &pipe_server || loop == &pipe_client) {
    pipe_close_cb_called = pipe_close_cb_called + 1;
    return (int)CONCAT71(0x3288,loop == &pipe_client);
  }
  pipe_close_cb_cold_1();
  puVar2 = uv_default_loop();
  uv_walk(puVar2,close_walk_cb,(void *)0x0);
  uv_run(puVar2,UV_RUN_DEFAULT);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if (iVar1 == 0) {
    return 0;
  }
  run_test_pipe_getsockname_blocking_cold_1();
  iVar1 = uv_is_closing((uv_handle_t *)puVar2);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close((uv_handle_t *)puVar2,(uv_close_cb)0x0);
  return extraout_EAX_01;
}

Assistant:

TEST_IMPL(pipe_getsockname) {
#if defined(NO_SELF_CONNECT)
  RETURN_SKIP(NO_SELF_CONNECT);
#endif
  uv_loop_t* loop;
  char buf[1024];
  size_t len;
  int r;

  loop = uv_default_loop();
  ASSERT(loop != NULL);

  r = uv_pipe_init(loop, &pipe_server, 0);
  ASSERT(r == 0);

  len = sizeof buf;
  r = uv_pipe_getsockname(&pipe_server, buf, &len);
  ASSERT(r == UV_EBADF);

  len = sizeof buf;
  r = uv_pipe_getpeername(&pipe_server, buf, &len);
  ASSERT(r == UV_EBADF);

  r = uv_pipe_bind(&pipe_server, TEST_PIPENAME);
  ASSERT(r == 0);

  len = sizeof buf;
  r = uv_pipe_getsockname(&pipe_server, buf, &len);
  ASSERT(r == 0);

  ASSERT(buf[len - 1] != 0);
  ASSERT(buf[len] == '\0');
  ASSERT(memcmp(buf, TEST_PIPENAME, len) == 0);

  len = sizeof buf;
  r = uv_pipe_getpeername(&pipe_server, buf, &len);
  ASSERT(r == UV_ENOTCONN);

  r = uv_listen((uv_stream_t*) &pipe_server, 0, pipe_server_connection_cb);
  ASSERT(r == 0);

  r = uv_pipe_init(loop, &pipe_client, 0);
  ASSERT(r == 0);

  len = sizeof buf;
  r = uv_pipe_getsockname(&pipe_client, buf, &len);
  ASSERT(r == UV_EBADF);

  len = sizeof buf;
  r = uv_pipe_getpeername(&pipe_client, buf, &len);
  ASSERT(r == UV_EBADF);

  uv_pipe_connect(&connect_req, &pipe_client, TEST_PIPENAME, pipe_client_connect_cb);

  len = sizeof buf;
  r = uv_pipe_getsockname(&pipe_client, buf, &len);
  ASSERT(r == 0 && len == 0);

  len = sizeof buf;
  r = uv_pipe_getpeername(&pipe_client, buf, &len);
  ASSERT(r == 0);

  ASSERT(buf[len - 1] != 0);
  ASSERT(memcmp(buf, TEST_PIPENAME, len) == 0);

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(r == 0);
  ASSERT(pipe_client_connect_cb_called == 1);
  ASSERT(pipe_close_cb_called == 2);

  MAKE_VALGRIND_HAPPY();
  return 0;
}